

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O0

void iutest::detail::iuUniversalPrinter<unsigned_long[10]>::Print
               (unsigned_long (*a) [10],iu_ostream *os)

{
  iu_ostream *os_local;
  unsigned_long (*a_local) [10];
  
  UniversalPrintArray<unsigned_long>(*a,10,os);
  return;
}

Assistant:

static void Print(const T(&a)[SIZE], iu_ostream* os)
    {
        UniversalPrintArray(a, SIZE, os);
    }